

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t_conflict *context)

{
  short sVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  wchar_t place;
  monster_conflict *mon;
  loc lVar7;
  long lVar8;
  player_state_conflict *ppVar9;
  char *pcVar10;
  undefined1 *puVar11;
  level_conflict *plVar12;
  byte bVar13;
  player_state_conflict in_stack_fffffffffffffe88;
  
  bVar13 = 0;
  plVar12 = world->levels;
  sVar1 = player->place;
  player_get_next_place(plVar12[sVar1].index,"down",L'\x01');
  mon = (monster_conflict *)monster_target_monster(context);
  lVar7 = cave_find_decoy(cave);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  if (mon != (monster_conflict *)0x0) {
    add_monster_message(mon,L'\x17',false);
    delete_monster_idx((chunk *)cave,mon->midx);
    return true;
  }
  if (lVar7.x != L'\0' && (ulong)lVar7 >> 0x20 != 0) {
    square_destroy_decoy(cave,lVar7);
    return true;
  }
  lVar7.x = (player->grid).x;
  lVar7.y = (player->grid).y;
  _Var3 = square_isno_teleport(cave,lVar7);
  if (!_Var3) {
    _Var3 = player_of_has(player,L'\x1d');
    if (!_Var3) {
      if ((context->origin).what == SRC_MONSTER) {
        ppVar9 = &player->state;
        puVar11 = &stack0xfffffffffffffe88;
        for (lVar8 = 0x13c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar11 = (char)ppVar9->stat_add[0];
          ppVar9 = (player_state_conflict *)((long)ppVar9 + (ulong)bVar13 * -2 + 1);
          puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
        }
        _Var3 = player_resists_effects(in_stack_fffffffffffffe88,L'\t');
        if (_Var3) {
          pcVar10 = "You resist the effect!";
          goto LAB_0013edaf;
        }
        _Var3 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)")
        ;
        if (_Var3) {
          pcVar10 = "Teleport resistance!";
          goto LAB_0013edaf;
        }
      }
      plVar12 = plVar12 + sVar1;
      _Var3 = quest_forbid_downstairs((int)player->place);
      _Var4 = true;
      if (plVar12->up == (char *)0x0) {
        _Var4 = mountain_top_possible(plVar12->index);
      }
      bVar2 = !_Var3;
      if (plVar12->down == (char *)0x0) {
        _Var5 = underworld_possible(plVar12->index);
        bVar2 = false;
        if (_Var5) {
          bVar2 = !_Var3;
        }
      }
      if ((_Var4 != false) && (bVar2)) {
        uVar6 = Rand_div(100);
        if ((int)uVar6 < 0x32) {
          _Var4 = false;
        }
        else {
          bVar2 = false;
        }
      }
      if (_Var4 != false) {
        pcVar10 = "You rise into the air.";
        if (plVar12->topography == TOP_CAVE) {
          pcVar10 = "You rise up through the ceiling.";
        }
        msgt(0x19,pcVar10);
        cmdq_flush();
        sVar1 = player->place;
        pcVar10 = "up";
LAB_0013eef1:
        place = player_get_next_place((int)sVar1,pcVar10,L'\x01');
        player_change_place(player,place);
        return true;
      }
      if (bVar2) {
        msgt(0x19,"You sink through the floor.");
        cmdq_flush();
        sVar1 = player->place;
        pcVar10 = "down";
        goto LAB_0013eef1;
      }
      pcVar10 = "Nothing happens.";
      goto LAB_0013edaf;
    }
    equip_learn_flag(player,L'\x1d');
  }
  pcVar10 = "Teleportation forbidden!";
LAB_0013edaf:
  msg(pcVar10);
  return true;
}

Assistant:

bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t *context)
{
	bool up = true;
	bool down = true;
	struct level *current = &world->levels[player->place];
	int target_place = player_get_next_place(current->index, "down", 1);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Check for monster targeting another monster */
	if (t_mon) {
		/* Monster is just gone */
		add_monster_message(t_mon, MON_MSG_DISAPPEAR, false);
		delete_monster_idx(cave, t_mon->midx);
		return true;
	}

	/* Targeted decoys get destroyed */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for a no teleport grid */
	if (square_isno_teleport(cave, player->grid)) {
		msg("Teleportation forbidden!");
		return true;
	}

	/* Check for a no teleport curse */
	if (player_of_has(player, OF_NO_TELEPORT)) {
		equip_learn_flag(player, OF_NO_TELEPORT);
		msg("Teleportation forbidden!");
		return true;
	}

	/* Resist hostile teleport */
	if (context->origin.what == SRC_MONSTER) {
		if (player_resists_effects(player->state, ELEM_NEXUS)) {
			msg("You resist the effect!");
			return true;
		} else if (player_has(player, PF_PHASEWALK)) {
			msg("Teleport resistance!");
			return true;
		}
	}

	/* No going up with force_descend or in the town */
	//if (OPT(player, birth_force_descend) || !player->depth)
	//	up = false;

	/* No forcing player down to quest levels if they can't leave */
	if (!up && quest_forbid_downstairs(target_place))
		down = false;

	/* Can't leave quest levels or go down deeper than the dungeon */
	if (quest_forbid_downstairs(player->place))
		down = false;

	/* Deal with underworld and mountain top */
	if (!current->up && !mountain_top_possible(current->index)) {
		up = false;
	}
	if (!current->down && !underworld_possible(current->index)) {
 		down = false;
	}
 
 	/* Determine up/down if not already done */
 	if (up && down) {
		if (randint0(100) < 50) {
 			up = false;
		} else {
 			down = false;
		}
 	}

	/*
	 * Now actually do the level change; flush the command queue to
	 * prevent the character from losing an action when first entering
	 * the new level (for instance, player moves putting an autopickup
	 * command in the queue and is then hit by a teleport level spell)
	 */
	if (up) {
		const char *msg = (current->topography == TOP_CAVE) ?
			"You rise up through the ceiling." : "You rise into the air.";
		msgt(MSG_TPLEVEL, msg);
		cmdq_flush();
		target_place = player_get_next_place(player->place, "up", 1);
		player_change_place(player, target_place);
 	} else if (down) {
 		msgt(MSG_TPLEVEL, "You sink through the floor.");
		cmdq_flush();
 
		//if (OPT(player, birth_force_descend)) {
		//	target_place = player_get_next_place(player->max_depth, "down", 1);
		//	player_change_place(player, target_place);
		//} else {
		target_place = player_get_next_place(player->place, "down", 1);
		player_change_place(player, target_place);
		//}
	} else {
		msg("Nothing happens.");
	}

	return true;
}